

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaWorker.cpp
# Opt level: O0

void __thiscall xmrig::CudaWorker::CudaWorker(CudaWorker *this,size_t id,CudaLaunchData *data)

{
  void *pvVar1;
  undefined8 *in_RDX;
  size_t in_RSI;
  CudaCnRunner *in_RDI;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined8 in_stack_ffffffffffffffc8;
  int priority;
  int64_t in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  WorkerJob<1UL> *in_stack_ffffffffffffffe0;
  
  priority = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  CudaThread::affinity((CudaThread *)(in_RDX + 2));
  Worker::Worker((Worker *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                 in_stack_ffffffffffffffd0,priority);
  (in_RDI->super_CudaBaseRunner).super_ICudaRunner._vptr_ICudaRunner =
       (_func_int **)&PTR__CudaWorker_002b8440;
  in_RDI[1].super_CudaBaseRunner.m_data = (CudaLaunchData *)*in_RDX;
  in_RDI[1].super_CudaBaseRunner.m_threadId = 0;
  WorkerJob<1UL>::WorkerJob(in_stack_ffffffffffffffe0);
  pvVar1 = operator_new(0x30);
  CudaCnRunner::CudaCnRunner
            (in_RDI,in_RSI,
             (CudaLaunchData *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  in_RDI[1].super_CudaBaseRunner.m_threadId = (size_t)pvVar1;
  if (in_RDI[1].super_CudaBaseRunner.m_threadId != 0) {
    (**(code **)(*(long *)in_RDI[1].super_CudaBaseRunner.m_threadId + 0x18))();
  }
  return;
}

Assistant:

xmrig::CudaWorker::CudaWorker(size_t id, const CudaLaunchData &data) :
    Worker(id, data.thread.affinity(), -1),
    m_miner(data.miner)
{
    m_runner = new CudaCnRunner(id, data);

    if (!m_runner || !m_runner->init()) {
        return;
    }
}